

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventThread.cpp
# Opt level: O3

void __thiscall EventThread::~EventThread(EventThread *this)

{
  Event *ev;
  
  (this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher =
       (_func_int **)&PTR_sendEventSync_001300f8;
  ev = (Event *)operator_new(0x18,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventThread.cpp"
                             ,0x2e);
  *(undefined8 *)&(ev->super_RefCount).mRefCount = 0xfffffffe00000000;
  (ev->super_RefCount)._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_00130198;
  ev->mPriority = 1;
  EventDispatcher::sendEvent(&this->super_EventDispatcher,ev);
  JHThread::Thread::Join(&(this->mThread).super_Thread);
  JHThread::Thread::~Thread(&(this->mThread).super_Thread);
  EventDispatcher::~EventDispatcher(&this->super_EventDispatcher);
  return;
}

Assistant:

EventThread::~EventThread()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	EventDispatcher::sendEvent( jh_new Event( Event::kShutdownEventId, PRIORITY_HIGH ) );
	LOG_NOISE( "Wait for thread to die" );
	mThread.Join();
}